

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O2

void * resizebox(lua_State *L,int idx,size_t newsize)

{
  void *in_RAX;
  lua_Alloc p_Var1;
  undefined8 *puVar2;
  void *pvVar3;
  void *ud;
  void *local_38;
  
  local_38 = in_RAX;
  p_Var1 = lua_getallocf(L,&local_38);
  puVar2 = (undefined8 *)lua_touserdata(L,idx);
  pvVar3 = (*p_Var1)(local_38,(void *)*puVar2,puVar2[1],newsize);
  if ((newsize != 0) && (pvVar3 == (void *)0x0)) {
    resizebox(L,idx,0);
    luaL_error(L,"not enough memory for buffer allocation");
  }
  *puVar2 = pvVar3;
  puVar2[1] = newsize;
  return pvVar3;
}

Assistant:

static void *resizebox (lua_State *L, int idx, size_t newsize) {
  void *ud;
  lua_Alloc allocf = lua_getallocf(L, &ud);
  UBox *box = (UBox *)lua_touserdata(L, idx);
  void *temp = allocf(ud, box->box, box->bsize, newsize);
  if (temp == NULL && newsize > 0) {  /* allocation error? */
    resizebox(L, idx, 0);  /* free buffer */
    luaL_error(L, "not enough memory for buffer allocation");
  }
  box->box = temp;
  box->bsize = newsize;
  return temp;
}